

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O1

bool ON_EvaluateNurbsBasisDerivatives(int order,double *knot,int der_count,double *N)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double stack_buffer [80];
  double *local_300;
  double local_2b8 [81];
  
  uVar3 = order - 1;
  lVar20 = (long)(((order >> 1) + 2) * order);
  uVar14 = (der_count + lVar20) * 8 + 8;
  if (uVar14 < 0x281) {
    pdVar4 = local_2b8;
    local_300 = (double *)0x0;
  }
  else {
    pdVar4 = (double *)onmalloc(uVar14);
    local_300 = pdVar4;
  }
  lVar5 = (long)order;
  pdVar10 = pdVar4 + lVar5;
  pdVar1 = pdVar4 + lVar20;
  *pdVar1 = (double)(pdVar10 + lVar5);
  lVar20 = (long)(int)uVar3;
  if (0 < der_count) {
    uVar14 = 0;
    pdVar9 = knot;
    uVar16 = uVar3;
    do {
      if (lVar20 - uVar14 != 0 && (long)uVar14 <= lVar20) {
        dVar23 = pdVar1[uVar14];
        uVar17 = 0;
        do {
          *(double *)((long)dVar23 + uVar17 * 8) = 1.0 / (knot[lVar20 + uVar17] - pdVar9[uVar17]);
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      pdVar9 = pdVar9 + 1;
      pdVar1[uVar14 + 1] = (double)((lVar20 - uVar14) * 8 + (long)pdVar1[uVar14]);
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 - 1;
    } while (uVar14 != (uint)der_count);
  }
  pdVar9 = N + lVar5;
  if (0 < order) {
    uVar16 = 1;
    lVar6 = -8;
    lVar13 = 0;
    uVar14 = 0;
    do {
      *pdVar4 = 1.0;
      if (0 < der_count) {
        lVar15 = lVar20 - uVar14;
        lVar21 = (long)pdVar9 + lVar13;
        uVar17 = 1;
        pdVar2 = pdVar10;
        lVar12 = lVar13;
        lVar19 = lVar6;
        uVar18 = uVar16;
        do {
          pdVar10 = pdVar4;
          pdVar4 = pdVar2;
          uVar7 = 1;
          if (1 < (int)uVar18) {
            uVar7 = (ulong)uVar18;
          }
          uVar11 = uVar17 - uVar14;
          if ((long)uVar11 < 1) {
            dVar23 = *pdVar10 * *(double *)((long)pdVar1[uVar17 - 1] + (uVar14 - uVar17) * 8);
            *pdVar4 = dVar23;
            dVar23 = dVar23 * pdVar9[uVar14];
            uVar11 = 1;
          }
          else {
            dVar23 = 0.0;
          }
          if (lVar15 < (long)uVar17) {
            if ((int)uVar11 <= lVar15) {
              lVar8 = uVar7 - 1;
              dVar22 = pdVar1[uVar17 - 1];
              do {
                dVar24 = (pdVar10[lVar8 + 1] - pdVar10[lVar8]) *
                         *(double *)((long)dVar22 + lVar12 + lVar8 * 8);
                pdVar4[lVar8 + 1] = dVar24;
                dVar23 = dVar23 + dVar24 * *(double *)(lVar21 + 8 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar8 < lVar15);
            }
          }
          else {
            if ((uVar11 & 0xffffffff) < uVar17) {
              dVar22 = pdVar1[uVar17 - 1];
              do {
                dVar24 = (pdVar10[uVar7] - pdVar10[uVar7 - 1]) *
                         *(double *)((long)dVar22 + lVar19 + uVar7 * 8);
                pdVar4[uVar7] = dVar24;
                dVar23 = dVar23 + dVar24 * *(double *)(lVar21 + uVar7 * 8);
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar17);
            }
            dVar22 = -pdVar10[uVar17 - 1] * *(double *)((long)pdVar1[uVar17 - 1] + uVar14 * 8);
            pdVar4[uVar17] = dVar22;
            dVar23 = dVar23 + dVar22 * pdVar9[uVar17 + uVar14];
          }
          pdVar9[uVar14] = dVar23;
          pdVar9 = pdVar9 + lVar5;
          uVar17 = uVar17 + 1;
          uVar18 = uVar18 + 1;
          lVar21 = lVar21 + lVar5 * 8;
          lVar19 = lVar19 + -8;
          lVar12 = lVar12 + -8;
          pdVar2 = pdVar10;
        } while (uVar17 != der_count + 1);
      }
      pdVar9 = pdVar9 + -(order * der_count);
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 - 1;
      lVar13 = lVar13 + 8;
      lVar6 = lVar6 + 8;
    } while (uVar14 != (uint)order);
  }
  if (der_count != 0) {
    dVar22 = (double)(int)uVar3;
    dVar23 = dVar22;
    do {
      uVar14 = (ulong)(uint)order;
      pdVar4 = pdVar9;
      if (order != 0) {
        do {
          pdVar9 = pdVar4 + 1;
          *pdVar4 = *pdVar4 * dVar23;
          uVar3 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar3;
          pdVar4 = pdVar9;
        } while (uVar3 != 0);
      }
      dVar22 = dVar22 + -1.0;
      dVar23 = dVar23 * dVar22;
      der_count = der_count + -1;
    } while (der_count != 0);
  }
  if (local_300 != (double *)0x0) {
    onfree(local_300);
  }
  return true;
}

Assistant:

bool ON_EvaluateNurbsBasisDerivatives(
  int order,
  const double* knot, 
  int der_count,
  double* N 
)
{
	double dN, c;
	const double *k0, *k1;
	double *a0, *a1, *ptr, **dk;
	int i, j, k, jmax;

	const int d = order-1;
	const int Nstride = -der_count*order;

	/* workspaces for knot differences and coefficients 
	 *
	 * a0[] and a1[] have order doubles
	 *
	 * dk[0] = array of d knot differences
	 * dk[1] = array of (d-1) knot differences
	 *
	 * dk[der_count-1] = 1.0/(knot[d] - knot[d-1])
	 * dk[der_count] = dummy pointer to make loop efficient
	 */

	//dk = (double**)alloca( (der_count+1) << 3 ); /* << 3 in case pointers are 8 bytes long */
	//a0 = (double*)alloca( (order*(2 + ((d+1)>>1))) << 3 ); /* d for a0, d for a1, d*order/2 for dk[]'s and slop to avoid /2 */
	//a1 = a0 + order;

  double stack_buffer[80];
  void* heap_buffer = 0;
  const size_t dbl_count = (order*(2 + ((d+1)>>1)));
  const size_t sz = ( dbl_count*sizeof(*a0) + (der_count+1)*sizeof(*dk) );

  a0 = (sz <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer = onmalloc(sz));
	a1 = a0 + order;
  dk = (double**)(a0 + dbl_count);

	/* initialize reciprocal of knot differences */
	dk[0] = a1 + order;
	for (k = 0; k < der_count; k++) {
		j = d-k;
		k0 = knot++;
		k1 = k0 + j;
		for (i = 0; i < j; i++) 
			dk[k][i] = 1.0/(*k1++ - *k0++);
		dk[k+1] = dk[k] + j;
	}
	dk--;
	/* dk[1] = 1/{t[d]-t[0], t[d+1]-t[1], ..., t[2d-2] - t[d-2], t[2d-1] - t[d-1]}
	 *       = diffs needed for 1rst derivative
	 * dk[2] = 1/{t[d]-t[1], t[d+1]-t[2], ..., t[2d-2] - t[d-1]}
	 *       = diffs needed for 2nd derivative
	 * ...
	 * dk[d] = 1/{t[d] - t[d-1]}
	 *       = diff needed for d-th derivative
	 *
	 * d[k][n] = 1.0/( t[d+n] - t[k-1+n] )
	 */
	
	N += order;
	/* set N[0] ,..., N[d] = 1rst derivatives, 
	 * N[order], ..., N[order+d] = 2nd, etc.
	 */
	for ( i=0; i<order; i++) {
		a0[0] = 1.0;
		for (k = 1; k <= der_count; k++) {
			/* compute k-th derivative of N_i^d up to d!/(d-k)! scaling factor */
			dN = 0.0;
			j = k-i; 
			if (j <= 0) {
				dN = (a1[0] = a0[0]*dk[k][i-k])*N[i];
				j = 1;
			}
			jmax = d-i; 
			if (jmax < k) {
				while (j <= jmax) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
			}
			else {
				/* sum j all the way to j = k */
				while (j < k) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
				dN += (a1[k] = -a0[k-1]*dk[k][i])*N[i+k];
			}

			/* d!/(d-k)!*dN = value of k-th derivative */
			N[i] = dN;
			N += order;
			/* a1[] s for next derivative = linear combination
			 * of a[]s used to compute this derivative.
			 */
			ptr = a0; a0 = a1; a1 = ptr;
		}
		N += Nstride;
	}

	/* apply d!/(d-k)! scaling factor */
	dN = c = (double)d;
	k = der_count;
	while (k--) {
		i = order;
		while (i--)
			*N++ *= c;
		dN -= 1.0;
		c *= dN;
	}

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return true;
}